

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::DuplicateColsPS
          (DuplicateColsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _j,int _k,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *scale,DataArray<int> *perm,shared_ptr<soplex::Tolerances> *tols,bool isFirst,
          bool isTheLast)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b5810;
  (this->super_PostStep).m_name = "DuplicateCols";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateColsPS_003b6150;
  this->m_j = _j;
  this->m_k = _k;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_j].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_loJ).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2) = uVar7;
  (this->m_loJ).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_loJ).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar9 = pnVar5[_j].m_backend.prec_elem;
  (this->m_loJ).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_loJ).m_backend.prec_elem = iVar9;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_j].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_upJ).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2) = uVar7;
  (this->m_upJ).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_upJ).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar9 = pnVar5[_j].m_backend.prec_elem;
  (this->m_upJ).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_upJ).m_backend.prec_elem = iVar9;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_k].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar5[_k].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar5[_k].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_k].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_loK).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2) = uVar7;
  (this->m_loK).m_backend.exp = pnVar5[_k].m_backend.exp;
  (this->m_loK).m_backend.neg = pnVar5[_k].m_backend.neg;
  iVar9 = pnVar5[_k].m_backend.prec_elem;
  (this->m_loK).m_backend.fpclass = pnVar5[_k].m_backend.fpclass;
  (this->m_loK).m_backend.prec_elem = iVar9;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_k].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar5[_k].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar5[_k].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_k].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_upK).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2) = uVar7;
  (this->m_upK).m_backend.exp = pnVar5[_k].m_backend.exp;
  (this->m_upK).m_backend.neg = pnVar5[_k].m_backend.neg;
  iVar9 = pnVar5[_k].m_backend.prec_elem;
  (this->m_upK).m_backend.fpclass = pnVar5[_k].m_backend.fpclass;
  (this->m_upK).m_backend.prec_elem = iVar9;
  uVar6 = *(undefined8 *)((scale->m_backend).data._M_elems + 2);
  uVar7 = *(undefined8 *)((scale->m_backend).data._M_elems + 4);
  uVar8 = *(undefined8 *)((scale->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_scale).m_backend.data._M_elems =
       *(undefined8 *)(scale->m_backend).data._M_elems;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 2) = uVar6;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 4) = uVar7;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 8) =
       *(undefined8 *)((scale->m_backend).data._M_elems + 8);
  (this->m_scale).m_backend.exp = (scale->m_backend).exp;
  (this->m_scale).m_backend.neg = (scale->m_backend).neg;
  iVar9 = (scale->m_backend).prec_elem;
  (this->m_scale).m_backend.fpclass = (scale->m_backend).fpclass;
  (this->m_scale).m_backend.prec_elem = iVar9;
  this->m_isFirst = isFirst;
  this->m_isLast = isTheLast;
  DataArray<int>::DataArray(&this->m_perm,perm);
  return;
}

Assistant:

DuplicateColsPS(const SPxLPBase<R>& lp, int _j, int _k, R scale, DataArray<int>  perm,
                      std::shared_ptr<Tolerances> tols, bool isFirst = false, bool isTheLast = false)
         : PostStep("DuplicateCols", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_k(_k)
         , m_loJ(lp.lower(_j))
         , m_upJ(lp.upper(_j))
         , m_loK(lp.lower(_k))
         , m_upK(lp.upper(_k))
         , m_scale(scale)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_perm(perm)
      {}